

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O0

complex<double> __thiscall
VarianceSwapsHestonAnalyticalPricer::functionD
          (VarianceSwapsHestonAnalyticalPricer *this,double tau,double omega)

{
  complex<double> *__y;
  double dVar1;
  double dVar2;
  complex<double> cVar3;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  double local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  double local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  double local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  complex<double> D_init;
  complex<double> g;
  complex<double> b;
  complex<double> a;
  double sigma;
  double omega_local;
  double tau_local;
  VarianceSwapsHestonAnalyticalPricer *this_local;
  
  dVar2 = omega;
  omega_local = tau;
  tau_local = (double)this;
  dVar1 = HestonModel::getVolOfVol(this->hestonModel_);
  aTerm(this,omega);
  bTerm(this,omega);
  b._M_value._0_8_ = dVar2;
  gTerm(this,omega);
  __y = (complex<double> *)(g._M_value + 8);
  g._M_value._0_8_ = dVar2;
  std::operator-((complex<double> *)(b._M_value + 8),__y);
  local_90 = dVar1 * dVar1;
  local_88._8_8_ = dVar2;
  std::operator/((complex<double> *)local_88,&local_90);
  local_b8 = 1.0;
  D_init._M_value._0_8_ = dVar2;
  std::operator-(__y);
  local_e8._8_8_ = dVar2;
  std::operator*((complex<double> *)local_e8,&omega_local);
  local_d8._8_8_ = dVar2;
  std::exp<double>((complex<double> *)local_d8);
  local_c8._8_8_ = dVar2;
  std::operator-(&local_b8,(complex<double> *)local_c8);
  local_b0._8_8_ = dVar2;
  std::operator*((complex<double> *)local_78,(complex<double> *)local_b0);
  local_100 = 1.0;
  local_a0._8_8_ = dVar2;
  std::operator-(__y);
  local_140._8_8_ = dVar2;
  std::operator*((complex<double> *)local_140,&omega_local);
  local_130._8_8_ = dVar2;
  std::exp<double>((complex<double> *)local_130);
  local_120._8_8_ = dVar2;
  std::operator*((complex<double> *)(D_init._M_value + 8),(complex<double> *)local_120);
  local_110._8_8_ = dVar2;
  std::operator-(&local_100,(complex<double> *)local_110);
  local_f8._8_8_ = dVar2;
  cVar3 = std::operator/((complex<double> *)local_a0,(complex<double> *)local_f8);
  return (complex<double>)cVar3._M_value;
}

Assistant:

std::complex<double> VarianceSwapsHestonAnalyticalPricer::
functionD(double tau, double omega) const {
    double sigma = hestonModel_->getVolOfVol();
    std::complex<double> a = aTerm(omega), 
                         b = bTerm(omega),
                         g = gTerm(omega);
    std::complex<double> D_init = (a-b)/(sigma*sigma); //definition during class
    return D_init*(1.-std::exp(-b*tau))/(1.-g*std::exp(-b*tau)); // in class
    // return D_init*(1.-std::exp(b*tau))/(1.-g*std::exp(b*tau)); // in PDF
}